

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O0

int ndn_forwarder_put_data(uint8_t *data,size_t length)

{
  size_t local_38;
  size_t name_len;
  uint8_t *name;
  size_t sStack_20;
  int ret;
  size_t length_local;
  uint8_t *data_local;
  
  if (data == (uint8_t *)0x0) {
    data_local._4_4_ = -0x10;
  }
  else {
    sStack_20 = length;
    length_local = (size_t)data;
    name._4_4_ = tlv_data_get_name(data,length,(uint8_t **)&name_len,&local_38);
    data_local._4_4_ = name._4_4_;
    if (name._4_4_ == 0) {
      data_local._4_4_ =
           fwd_data_pipeline((uint8_t *)length_local,sStack_20,(uint8_t *)name_len,local_38,0xffff);
    }
  }
  return data_local._4_4_;
}

Assistant:

int
ndn_forwarder_put_data(uint8_t* data, size_t length)
{
  int ret;
  uint8_t *name;
  size_t name_len;

  if(data == NULL)
    return NDN_INVALID_POINTER;
  ret = tlv_data_get_name(data, length, &name, &name_len);
  if(ret != NDN_SUCCESS)
    return ret;

  return fwd_data_pipeline(data, length, name, name_len, NDN_INVALID_ID);
}